

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_bx32(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  TCGContext_conflict12 *s_00;
  int imm;
  DisasJumpType DVar4;
  TCGTemp *ts;
  TCGTemp *pTVar5;
  TCGTemp *pTVar6;
  DisasCompare_conflict2 c;
  DisasCompare_conflict2 local_48;
  
  uVar1 = (s->fields).presentO;
  if (((uVar1 & 1) != 0) && ((uVar1 & 4) != 0)) {
    s_00 = s->uc->tcg_ctx;
    iVar2 = (s->fields).c[0];
    uVar3 = (s->fields).c[2];
    imm = 0;
    if ((uVar1 >> 0x12 & 1) != 0) {
      imm = (s->fields).c[1];
    }
    local_48._0_1_ = s->insn->data == 0 | 10;
    local_48.is_64 = false;
    local_48.g1 = false;
    local_48.g2 = false;
    ts = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
    tcg_gen_op3_s390x(s_00,INDEX_op_add_i64,(TCGArg)ts,
                      (TCGArg)((long)&s_00->pool_cur + (long)s_00->regs[iVar2]),
                      (TCGArg)((long)&s_00->pool_cur + (long)s_00->regs[(int)uVar3]));
    pTVar5 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I32,false);
    local_48.u.s32.a = (TCGv_i32)((long)pTVar5 - (long)s_00);
    pTVar6 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I32,false);
    local_48.u.s32.b = (TCGv_i32)((long)pTVar6 - (long)s_00);
    tcg_gen_extrl_i64_i32_s390x
              (s_00,(TCGv_i32)((long)pTVar5 - (long)s_00),(TCGv_i64)((long)ts - (long)s_00));
    tcg_gen_extrl_i64_i32_s390x
              (s_00,(TCGv_i32)((long)pTVar6 - (long)s_00),s_00->regs[(int)(uVar3 | 1)]);
    tcg_gen_deposit_i64_s390x
              (s_00,s_00->regs[iVar2],s_00->regs[iVar2],(TCGv_i64)((long)ts - (long)s_00),0,0x20);
    tcg_temp_free_internal_s390x(s_00,ts);
    DVar4 = help_branch(s,&local_48,(_Bool)((byte)(uVar1 >> 0x12) & 1),imm,o->in2);
    return DVar4;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_bx32(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, r1);
    int r3 = get_field(s, r3);
    bool is_imm = have_field(s, i2);
    int imm = is_imm ? get_field(s, i2) : 0;
    DisasCompare c;
    TCGv_i64 t;

    c.cond = (s->insn->data ? TCG_COND_LE : TCG_COND_GT);
    c.is_64 = false;
    c.g1 = false;
    c.g2 = false;

    t = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_add_i64(tcg_ctx, t, tcg_ctx->regs[r1], tcg_ctx->regs[r3]);
    c.u.s32.a = tcg_temp_new_i32(tcg_ctx);
    c.u.s32.b = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32(tcg_ctx, c.u.s32.a, t);
    tcg_gen_extrl_i64_i32(tcg_ctx, c.u.s32.b, tcg_ctx->regs[r3 | 1]);
    store_reg32_i64(tcg_ctx, r1, t);
    tcg_temp_free_i64(tcg_ctx, t);

    return help_branch(s, &c, is_imm, imm, o->in2);
}